

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdUint32x4OperationX86X64.cpp
# Opt level: O0

SIMDValue Js::SIMDUint32x4Operation::OpLessThan(SIMDValue *aValue,SIMDValue *bValue)

{
  _x86_SIMDValue _Var1;
  _x86_SIMDValue _Var2;
  anon_union_16_9_4d7543c8_for__SIMDValue_0 aVar3;
  X86SIMDValue signBits;
  X86SIMDValue tmpbValue;
  X86SIMDValue tmpaValue;
  X86SIMDValue x86Result;
  SIMDValue *bValue_local;
  SIMDValue *aValue_local;
  int local_28;
  int iStack_24;
  int local_18;
  int iStack_14;
  
  _Var1 = _x86_SIMDValue::ToX86SIMDValue(aValue);
  _Var2 = _x86_SIMDValue::ToX86SIMDValue(bValue);
  tmpbValue.field_0.i64[1] = _Var1.field_0._0_8_;
  signBits.field_0.i64[1] = _Var2.field_0._0_8_;
  local_18 = (int)(signBits.field_0.i64[1] ^ 0x8000000080000000U);
  iStack_14 = (int)((signBits.field_0.i64[1] ^ 0x8000000080000000U) >> 0x20);
  local_28 = (int)(tmpbValue.field_0.i64[1] ^ 0x8000000080000000U);
  iStack_24 = (int)((tmpbValue.field_0.i64[1] ^ 0x8000000080000000U) >> 0x20);
  tmpaValue.field_0.i32[2] = -(uint)(local_28 < local_18);
  tmpaValue.field_0.i32[3] = -(uint)(iStack_24 < iStack_14);
  aVar3 = (anon_union_16_9_4d7543c8_for__SIMDValue_0)
          _x86_SIMDValue::ToSIMDValue((_x86_SIMDValue *)((long)&tmpaValue.field_0 + 8));
  return (SIMDValue)aVar3;
}

Assistant:

SIMDValue SIMDUint32x4Operation::OpLessThan(const SIMDValue& aValue, const SIMDValue& bValue)
    {
        X86SIMDValue x86Result;
        X86SIMDValue tmpaValue = X86SIMDValue::ToX86SIMDValue(aValue);
        X86SIMDValue tmpbValue = X86SIMDValue::ToX86SIMDValue(bValue);
        X86SIMDValue signBits;
        signBits.m128i_value = _mm_set1_epi32(0x80000000);

        // Signed comparison of unsigned ints can be done if the ints have the "sign" bit xored with 1
        tmpaValue.m128i_value = _mm_xor_si128(tmpaValue.m128i_value, signBits.m128i_value);
        tmpbValue.m128i_value = _mm_xor_si128(tmpbValue.m128i_value, signBits.m128i_value);
        x86Result.m128i_value = _mm_cmplt_epi32(tmpaValue.m128i_value, tmpbValue.m128i_value); // compare a < b?

        return X86SIMDValue::ToSIMDValue(x86Result);
    }